

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O2

void duckdb::ParquetBaseStringOperator::WriteToStream<duckdb::string_t,duckdb::string_t>
               (string_t *target_value,WriteStream *ser)

{
  char *pcVar1;
  undefined1 local_14 [4];
  
  (*(code *)**(undefined8 **)ser)(ser,local_14,4);
  if ((target_value->value).pointer.length < 0xd) {
    pcVar1 = (char *)((long)&target_value->value + 4);
  }
  else {
    pcVar1 = (target_value->value).pointer.ptr;
  }
  (*(code *)**(undefined8 **)ser)(ser,pcVar1);
  return;
}

Assistant:

static void WriteToStream(const TGT &target_value, WriteStream &ser) {
		ser.Write<uint32_t>(target_value.GetSize());
		ser.WriteData(const_data_ptr_cast(target_value.GetData()), target_value.GetSize());
	}